

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O1

bool __thiscall QProcessPrivate::waitForBytesWritten(QProcessPrivate *this,QDeadlineTimer *deadline)

{
  QRingBuffer *pQVar1;
  int iVar2;
  byte unaff_BPL;
  long in_FS_OFFSET;
  QString local_78;
  pollfd local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    pQVar1 = (this->super_QIODevicePrivate).writeBuffer.m_buf;
    if ((pQVar1 == (QRingBuffer *)0x0) || (pQVar1->bufferSize == 0)) goto LAB_00433200;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (pollfd)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_14f7919::QProcessPoller::QProcessPoller((QProcessPoller *)&local_58,this);
    iVar2 = qt_safe_poll(&local_58,4,*deadline);
    if (iVar2 < 0) {
      iVar2 = 3;
    }
    else if (iVar2 == 0) {
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      setError(this,Timedout,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar2 = 1;
      unaff_BPL = 0;
    }
    else {
      if ((local_58.fd < 0) || (((ulong)local_58 & 0x3c000000000000) == 0)) {
        if ((-1 < (int)puStack_50) && (((ulong)puStack_50 & 0x39000000000000) != 0)) {
          _q_canReadStandardOutput(this);
        }
        if ((-1 < (int)local_48) && (((ulong)local_48 & 0x39000000000000) != 0)) {
          _q_canReadStandardError(this);
        }
        iVar2 = 0;
        if (this->processState != '\0') {
          if (((int)puStack_40 < 0) || (((ulong)puStack_40 & 0x39000000000000) == 0))
          goto LAB_004331f3;
          processFinished(this);
        }
        unaff_BPL = false;
      }
      else {
        unaff_BPL = _q_canWrite(this);
      }
      iVar2 = 1;
    }
LAB_004331f3:
  } while (iVar2 == 0);
  if (iVar2 == 3) {
LAB_00433200:
    unaff_BPL = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (bool)(unaff_BPL & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::waitForBytesWritten(const QDeadlineTimer &deadline)
{
#if defined (QPROCESS_DEBUG)
    qDebug("QProcessPrivate::waitForBytesWritten(%lld)", deadline.remainingTime());
#endif

    while (!writeBuffer.isEmpty()) {
        QProcessPoller poller(*this);

        int ret = poller.poll(deadline);

        if (ret < 0) {
            break;
        }

        if (ret == 0) {
            setError(QProcess::Timedout);
            return false;
        }

        if (qt_pollfd_check(poller.stdinPipe(), POLLOUT))
            return _q_canWrite();

        if (qt_pollfd_check(poller.stdoutPipe(), POLLIN))
            _q_canReadStandardOutput();

        if (qt_pollfd_check(poller.stderrPipe(), POLLIN))
            _q_canReadStandardError();

        // Signals triggered by I/O may have stopped this process:
        if (processState == QProcess::NotRunning)
            return false;

        if (qt_pollfd_check(poller.forkfd(), POLLIN)) {
            processFinished();
            return false;
        }
    }

    return false;
}